

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operator.cpp
# Opt level: O3

CustomOperator * ExprEval::Operator::get_custom_specification(string *symbol)

{
  CustomOperator *pCVar1;
  pointer __s2;
  size_t __n;
  int iVar2;
  CustomOperator *pCVar3;
  long lVar4;
  long lVar5;
  
  pCVar1 = (CustomOperator *)*custom_operator_table;
  if (custom_operator_table[1] - (long)pCVar1 != 0) {
    lVar5 = (custom_operator_table[1] - (long)pCVar1 >> 3) * -0x79435e50d79435e5;
    __s2 = (symbol->_M_dataplus)._M_p;
    __n = symbol->_M_string_length;
    lVar5 = lVar5 + (ulong)(lVar5 == 0);
    lVar4 = 0;
    pCVar3 = pCVar1;
    do {
      if ((pCVar3->symbol)._M_string_length == __n) {
        if (__n == 0) {
          return pCVar1 + lVar4;
        }
        iVar2 = bcmp((pCVar3->symbol)._M_dataplus._M_p,__s2,__n);
        if (iVar2 == 0) {
          return pCVar3;
        }
      }
      lVar4 = lVar4 + 1;
      pCVar3 = pCVar3 + 1;
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
  }
  return (CustomOperator *)0x0;
}

Assistant:

Operator::CustomOperator* get_custom_specification(const std::string& symbol){
            auto table = custom_operator_table;
            for(size_t i=0; i<table->size(); ++i){
                if(table->at(i).symbol == symbol) return &(table->at(i));
            }
            return nullptr;
        }